

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86.cpp
# Opt level: O1

int __thiscall ncnn::Clip_x86::forward_inplace(Clip_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  _func_int **pp_Var4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  undefined1 (*pauVar10) [16];
  int iVar11;
  undefined1 auVar12 [16];
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    pp_Var4 = this->_vptr_Clip_x86;
    lVar9 = 0;
    do {
      pauVar10 = (undefined1 (*) [16])
                 (bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar6 < 4) {
        uVar7 = 0;
      }
      else {
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var4[-3]);
        uVar2 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var4[-3]);
        iVar11 = 3;
        do {
          auVar12._4_4_ = uVar1;
          auVar12._0_4_ = uVar1;
          auVar12._8_4_ = uVar1;
          auVar12._12_4_ = uVar1;
          auVar12 = maxps(*pauVar10,auVar12);
          auVar5._4_4_ = uVar2;
          auVar5._0_4_ = uVar2;
          auVar5._8_4_ = uVar2;
          auVar5._12_4_ = uVar2;
          auVar12 = minps(auVar12,auVar5);
          *pauVar10 = auVar12;
          pauVar10 = pauVar10 + 1;
          iVar11 = iVar11 + 4;
          uVar7 = uVar6 & 0xfffffffc;
        } while (iVar11 < (int)uVar6);
      }
      if (uVar6 - uVar7 != 0 && (int)uVar7 <= (int)uVar6) {
        lVar8 = 0;
        do {
          if (*(float *)(*pauVar10 + lVar8 * 4) < *(float *)(&this->field_0xd0 + (long)pp_Var4[-3]))
          {
            *(float *)(*pauVar10 + lVar8 * 4) = *(float *)(&this->field_0xd0 + (long)pp_Var4[-3]);
          }
          if (*(float *)(&this->field_0xd4 + (long)pp_Var4[-3]) < *(float *)(*pauVar10 + lVar8 * 4))
          {
            *(float *)(*pauVar10 + lVar8 * 4) = *(float *)(&this->field_0xd4 + (long)pp_Var4[-3]);
          }
          lVar8 = lVar8 + 1;
        } while (uVar6 - uVar7 != (int)lVar8);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar3);
  }
  return 0;
}

Assistant:

int Clip_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _min_avx512 = _mm512_set1_ps(min);
        __m512 _max_avx512 = _mm512_set1_ps(max);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_max_ps(_p, _min_avx512);
            _p = _mm512_min_ps(_p, _max_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _min_avx = _mm256_set1_ps(min);
        __m256 _max_avx = _mm256_set1_ps(max);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_max_ps(_p, _min_avx);
            _p = _mm256_min_ps(_p, _max_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _min = _mm_set1_ps(min);
        __m128 _max = _mm_set1_ps(max);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_max_ps(_p, _min);
            _p = _mm_min_ps(_p, _max);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < min)
                *ptr = min;
            if (*ptr > max)
                *ptr = max;
            ptr++;
        }
    }

    return 0;
}